

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::FormatString<char[32],char[27],unsigned_long,char[61],unsigned_int,char[3]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [32],char (*Args_1) [27],
          unsigned_long *Args_2,char (*Args_3) [61],uint *Args_4,char (*Args_5) [3])

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[32],char[27],unsigned_long,char[61],unsigned_int,char[3]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [32])this,(char (*) [27])Args,(unsigned_long *)Args_1,(char (*) [61])Args_2,
             (uint *)Args_3,(char (*) [3])Args_4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}